

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

void rloco(obj *obj)

{
  char x;
  char y;
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  int oty;
  int otx;
  int ty;
  int tx;
  obj *obj_local;
  
  x = obj->ox;
  y = obj->oy;
  _ty = obj;
  if (((obj->otyp == 0x10e) &&
      (((((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x144 ||
        (((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x146)) ||
       (((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x145)))) &&
     (bVar1 = revive_corpse(obj), bVar1 != '\0')) {
    return;
  }
  obj_extract_self(_ty);
  rloco_pos(_ty,level,&otx,&oty);
  bVar1 = flooreffects(_ty,otx,oty,"fall");
  if (bVar1 != '\0') {
    return;
  }
  if ((x == 0) && (y == 0)) goto LAB_002fb3ad;
  bVar1 = costly_spot(x,y);
  if (bVar1 != '\0') {
    bVar1 = costly_spot((xchar)otx,(xchar)oty);
    if (bVar1 != '\0') {
      pcVar2 = in_rooms(level,(xchar)otx,(xchar)oty,0);
      pcVar3 = in_rooms(level,x,y,0);
      pcVar2 = strchr(pcVar2,(int)*pcVar3);
      if (pcVar2 != (char *)0x0) goto LAB_002fb3a2;
    }
    bVar1 = costly_spot(u.ux,u.uy);
    if (bVar1 != '\0') {
      pcVar2 = in_rooms(level,x,y,0);
      pcVar2 = strchr(u.urooms,(int)*pcVar2);
      if (pcVar2 != (char *)0x0) {
        addtobill(_ty,'\0','\0','\0');
        goto LAB_002fb3a2;
      }
    }
    stolen_value(_ty,x,y,'\0','\0');
  }
LAB_002fb3a2:
  newsym((int)x,(int)y);
LAB_002fb3ad:
  place_object(_ty,level,otx,oty);
  newsym(otx,oty);
  return;
}

Assistant:

void rloco(struct obj *obj)
{
	int tx, ty, otx, oty;

	otx = obj->ox;
	oty = obj->oy;

	if (obj->otyp == CORPSE && is_rider(&mons[obj->corpsenm])) {
	    if (revive_corpse(obj)) return;
	}

	obj_extract_self(obj);
	rloco_pos(obj, level, &tx, &ty);

	if (flooreffects(obj, tx, ty, "fall")) {
	    return;
	} else if (otx == 0 && oty == 0) {
	    ;	/* fell through a trap door; no update of old loc needed */
	} else {
	    if (costly_spot(otx, oty)
	      && (!costly_spot(tx, ty) ||
		  !strchr(in_rooms(level, tx, ty, 0), *in_rooms(level, otx, oty, 0)))) {
		if (costly_spot(u.ux, u.uy) &&
			    strchr(u.urooms, *in_rooms(level, otx, oty, 0)))
		    addtobill(obj, FALSE, FALSE, FALSE);
		else stolen_value(obj, otx, oty, FALSE, FALSE);
	    }
	    newsym(otx, oty);	/* update old location */
	}
	place_object(obj, level, tx, ty);
	newsym(tx, ty);
}